

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvtBroadphase.cpp
# Opt level: O2

void __thiscall cbtDbvtBroadphase::collide(cbtDbvtBroadphase *this,cbtDispatcher *dispatcher)

{
  undefined4 uVar1;
  cbtDbvtProxy *pcVar2;
  cbtDbvtProxy *pcVar3;
  long lVar4;
  undefined4 uVar5;
  byte bVar6;
  bool bVar7;
  uint uVar8;
  cbtDbvtNode *pcVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  undefined1 *this_00;
  cbtDbvtProxy *item;
  int i;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar16 [16];
  undefined1 in_ZMM2 [64];
  cbtDbvtVolume curAabb;
  undefined4 extraout_var;
  
  this_00 = &this->field_0x8;
  cbtDbvt::optimizeIncremental
            ((cbtDbvt *)this_00,(this->m_dupdates * *(int *)&this->field_0x1c) / 100 + 1);
  if (this->m_fixedleft != 0) {
    iVar12 = (this->m_fupdates * *(int *)&this->field_0x5c) / 100 + 1;
    cbtDbvt::optimizeIncremental((cbtDbvt *)&this->field_0x48,iVar12);
    uVar8 = this->m_fixedleft - iVar12;
    this->m_fixedleft = ~((int)uVar8 >> 0x1f) & uVar8;
  }
  iVar12 = (this->m_stageCurrent + 1) % 2;
  this->m_stageCurrent = iVar12;
  if (this->m_stageRoots[iVar12] != (cbtDbvtProxy *)0x0) {
    item = this->m_stageRoots[iVar12];
    do {
      pcVar2 = item->links[1];
      listremove<cbtDbvtProxy>(item,this->m_stageRoots + item->stage);
      item->links[0] = (cbtDbvtProxy *)0x0;
      pcVar3 = this->m_stageRoots[2];
      item->links[1] = pcVar3;
      if (pcVar3 != (cbtDbvtProxy *)0x0) {
        pcVar3->links[0] = item;
      }
      this->m_stageRoots[2] = item;
      cbtDbvt::remove((cbtDbvt *)this_00,(char *)item->leaf);
      curAabb.mi.m_floats._0_8_ = *(undefined8 *)(item->super_cbtBroadphaseProxy).m_aabbMin.m_floats
      ;
      curAabb.mi.m_floats._8_8_ =
           *(undefined8 *)((item->super_cbtBroadphaseProxy).m_aabbMin.m_floats + 2);
      curAabb.mx.m_floats._0_8_ = *(undefined8 *)(item->super_cbtBroadphaseProxy).m_aabbMax.m_floats
      ;
      curAabb.mx.m_floats._8_8_ =
           *(undefined8 *)((item->super_cbtBroadphaseProxy).m_aabbMax.m_floats + 2);
      pcVar9 = cbtDbvt::insert((cbtDbvt *)&this->field_0x48,&curAabb,item);
      item->leaf = pcVar9;
      item->stage = 2;
      item = pcVar2;
    } while (pcVar2 != (cbtDbvtProxy *)0x0);
    this->m_fixedleft = *(int *)&this->field_0x5c;
    this->m_needcleanup = true;
  }
  curAabb.mi.m_floats._0_8_ = &PTR__ICollide_01193858;
  bVar6 = this->m_deferedcollide;
  curAabb.mi.m_floats._8_8_ = this;
  if ((bool)bVar6 == true) {
    cbtDbvt::collideTTpersistentStack
              ((cbtDbvt *)this_00,*(cbtDbvtNode **)&this->field_0x8,
               *(cbtDbvtNode **)&this->field_0x48,(ICollide *)&curAabb);
    bVar6 = this->m_deferedcollide;
  }
  if ((bVar6 & 1) != 0) {
    cbtDbvt::collideTTpersistentStack
              ((cbtDbvt *)this_00,*(cbtDbvtNode **)this_00,*(cbtDbvtNode **)this_00,
               (ICollide *)&curAabb);
  }
  auVar16 = in_ZMM2._0_16_;
  auVar15 = in_ZMM1._0_16_;
  if (this->m_needcleanup == true) {
    iVar12 = (*(this->m_paircache->super_cbtOverlappingPairCallback).
               _vptr_cbtOverlappingPairCallback[7])();
    auVar16 = in_ZMM2._0_16_;
    auVar15 = in_ZMM1._0_16_;
    lVar10 = CONCAT44(extraout_var,iVar12);
    iVar12 = *(int *)(lVar10 + 4);
    if (0 < iVar12) {
      iVar13 = (this->m_cupdates * iVar12) / 100;
      if (iVar13 < this->m_newpairs) {
        iVar13 = this->m_newpairs;
      }
      if (iVar12 < iVar13) {
        iVar13 = iVar12;
      }
      iVar12 = 0;
      while( true ) {
        auVar16 = in_ZMM2._0_16_;
        auVar15 = in_ZMM1._0_16_;
        if (iVar13 <= iVar12) break;
        lVar11 = (long)((this->m_cid + iVar12) % *(int *)(lVar10 + 4)) * 0x20;
        lVar4 = *(long *)(*(long *)(lVar10 + 0x10) + lVar11);
        lVar11 = *(long *)(*(long *)(lVar10 + 0x10) + 8 + lVar11);
        bVar7 = Intersect(*(cbtDbvtAabbMm **)(lVar4 + 0x38),*(cbtDbvtAabbMm **)(lVar11 + 0x38));
        if (!bVar7) {
          (*(this->m_paircache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback
            [3])(this->m_paircache,lVar4,lVar11,dispatcher);
          iVar13 = iVar13 + -1;
          iVar12 = iVar12 + -1;
        }
        iVar12 = iVar12 + 1;
      }
      if (*(int *)(lVar10 + 4) < 1) {
        iVar12 = 0;
      }
      else {
        iVar12 = (iVar13 + this->m_cid) % *(int *)(lVar10 + 4);
      }
      this->m_cid = iVar12;
    }
  }
  this->m_pid = this->m_pid + 1;
  this->m_newpairs = 1;
  this->m_needcleanup = false;
  uVar1 = this->m_updates_call;
  uVar5 = this->m_updates_done;
  auVar14._4_4_ = uVar5;
  auVar14._0_4_ = uVar1;
  auVar15 = vcvtusi2ss_avx512f(auVar15,uVar1);
  auVar16 = vcvtusi2ss_avx512f(auVar16,uVar5);
  auVar14._8_8_ = 0;
  auVar14 = vpsrld_avx(auVar14,1);
  this->m_updates_ratio = (cbtScalar)((uint)(uVar1 != 0) * (int)(auVar16._0_4_ / auVar15._0_4_));
  this->m_updates_call = (int)auVar14._0_8_;
  this->m_updates_done = (int)((ulong)auVar14._0_8_ >> 0x20);
  return;
}

Assistant:

void cbtDbvtBroadphase::collide(cbtDispatcher* dispatcher)
{
	/*printf("---------------------------------------------------------\n");
	printf("m_sets[0].m_leaves=%d\n",m_sets[0].m_leaves);
	printf("m_sets[1].m_leaves=%d\n",m_sets[1].m_leaves);
	printf("numPairs = %d\n",getOverlappingPairCache()->getNumOverlappingPairs());
	{
		int i;
		for (i=0;i<getOverlappingPairCache()->getNumOverlappingPairs();i++)
		{
			printf("pair[%d]=(%d,%d),",i,getOverlappingPairCache()->getOverlappingPairArray()[i].m_pProxy0->getUid(),
				getOverlappingPairCache()->getOverlappingPairArray()[i].m_pProxy1->getUid());
		}
		printf("\n");
	}
*/

	SPC(m_profiling.m_total);
	/* optimize				*/
	m_sets[0].optimizeIncremental(1 + (m_sets[0].m_leaves * m_dupdates) / 100);
	if (m_fixedleft)
	{
		const int count = 1 + (m_sets[1].m_leaves * m_fupdates) / 100;
		m_sets[1].optimizeIncremental(1 + (m_sets[1].m_leaves * m_fupdates) / 100);
		m_fixedleft = cbtMax<int>(0, m_fixedleft - count);
	}
	/* dynamic -> fixed set	*/
	m_stageCurrent = (m_stageCurrent + 1) % STAGECOUNT;
	cbtDbvtProxy* current = m_stageRoots[m_stageCurrent];
	if (current)
	{
#if DBVT_BP_ACCURATESLEEPING
		cbtDbvtTreeCollider collider(this);
#endif
		do
		{
			cbtDbvtProxy* next = current->links[1];
			listremove(current, m_stageRoots[current->stage]);
			listappend(current, m_stageRoots[STAGECOUNT]);
#if DBVT_BP_ACCURATESLEEPING
			m_paircache->removeOverlappingPairsContainingProxy(current, dispatcher);
			collider.proxy = current;
			cbtDbvt::collideTV(m_sets[0].m_root, current->aabb, collider);
			cbtDbvt::collideTV(m_sets[1].m_root, current->aabb, collider);
#endif
			m_sets[0].remove(current->leaf);
			ATTRIBUTE_ALIGNED16(cbtDbvtVolume)
			curAabb = cbtDbvtVolume::FromMM(current->m_aabbMin, current->m_aabbMax);
			current->leaf = m_sets[1].insert(curAabb, current);
			current->stage = STAGECOUNT;
			current = next;
		} while (current);
		m_fixedleft = m_sets[1].m_leaves;
		m_needcleanup = true;
	}
	/* collide dynamics		*/
	{
		cbtDbvtTreeCollider collider(this);
		if (m_deferedcollide)
		{
			SPC(m_profiling.m_fdcollide);
			m_sets[0].collideTTpersistentStack(m_sets[0].m_root, m_sets[1].m_root, collider);
		}
		if (m_deferedcollide)
		{
			SPC(m_profiling.m_ddcollide);
			m_sets[0].collideTTpersistentStack(m_sets[0].m_root, m_sets[0].m_root, collider);
		}
	}
	/* clean up				*/
	if (m_needcleanup)
	{
		SPC(m_profiling.m_cleanup);
		cbtBroadphasePairArray& pairs = m_paircache->getOverlappingPairArray();
		if (pairs.size() > 0)
		{
			int ni = cbtMin(pairs.size(), cbtMax<int>(m_newpairs, (pairs.size() * m_cupdates) / 100));
			for (int i = 0; i < ni; ++i)
			{
				cbtBroadphasePair& p = pairs[(m_cid + i) % pairs.size()];
				cbtDbvtProxy* pa = (cbtDbvtProxy*)p.m_pProxy0;
				cbtDbvtProxy* pb = (cbtDbvtProxy*)p.m_pProxy1;
				if (!Intersect(pa->leaf->volume, pb->leaf->volume))
				{
#if DBVT_BP_SORTPAIRS
					if (pa->m_uniqueId > pb->m_uniqueId)
						cbtSwap(pa, pb);
#endif
					m_paircache->removeOverlappingPair(pa, pb, dispatcher);
					--ni;
					--i;
				}
			}
			if (pairs.size() > 0)
				m_cid = (m_cid + ni) % pairs.size();
			else
				m_cid = 0;
		}
	}
	++m_pid;
	m_newpairs = 1;
	m_needcleanup = false;
	if (m_updates_call > 0)
	{
		m_updates_ratio = m_updates_done / (cbtScalar)m_updates_call;
	}
	else
	{
		m_updates_ratio = 0;
	}
	m_updates_done /= 2;
	m_updates_call /= 2;
}